

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.c
# Opt level: O1

int32_t pool_sync2(ProcPool *pool)

{
  bool bVar1;
  uint uVar2;
  _Bool _Var3;
  int iVar4;
  char *pcVar5;
  Process *pPVar6;
  long lVar7;
  int32_t i;
  long lVar8;
  char **ppcVar9;
  bool bVar10;
  int32_t i_1;
  int exit_status;
  uint local_50;
  int32_t local_4c;
  Process *local_48;
  char **local_40;
  ProcPool *local_38;
  
  local_48 = pool->procs;
  local_40 = pool->procs[0].args;
  bVar10 = false;
  local_38 = pool;
  do {
    bVar1 = 0 < pool->max_num_procs;
    if (0 < pool->max_num_procs) {
      lVar7 = 0;
      pPVar6 = local_48;
      ppcVar9 = local_40;
      do {
        iVar4 = 6;
        if (pPVar6[lVar7].valid == true) {
          pPVar6 = pPVar6 + lVar7;
          if (pool->aborted == true) {
            kill(pPVar6->pid,0xf);
          }
          local_50 = 0;
          _Var3 = proc_terminated(pPVar6->pid,(int *)&local_50);
          uVar2 = local_50;
          iVar4 = 0;
          if (_Var3) {
            pcVar5 = "failed";
            if (local_50 == 0) {
              pcVar5 = "exited correctly";
            }
            printf("Process %d %s [status=%d]: ",(ulong)(uint)pPVar6->pid,pcVar5,(ulong)local_50);
            printf("(CMD");
            lVar8 = 0;
            do {
              if (ppcVar9[lVar8] == (char *)0x0) break;
              printf(" %s");
              lVar8 = lVar8 + 1;
            } while (lVar8 != 0xff);
            puts(")");
            pool = local_38;
            if (local_38->on_async_proc_exit != (_func_void_Process_ptr_int_void_ptr *)0x0) {
              (*local_38->on_async_proc_exit)(pPVar6,uVar2,pPVar6->user_handle);
            }
            pPVar6->pid = -0x80000000;
            lVar8 = 0;
            do {
              free(ppcVar9[lVar8]);
              lVar8 = lVar8 + 1;
            } while (lVar8 != 0x100);
            memset(pPVar6,0,0x810);
            iVar4 = 1;
            local_4c = (int32_t)lVar7;
          }
          bVar10 = true;
          pPVar6 = local_48;
        }
        if ((iVar4 != 6) && (iVar4 != 0)) break;
        lVar7 = lVar7 + 1;
        iVar4 = pool->max_num_procs;
        if (0xf < iVar4) {
          iVar4 = 0x10;
        }
        ppcVar9 = ppcVar9 + 0x102;
        bVar1 = lVar7 < iVar4;
      } while (lVar7 < iVar4);
    }
    if (bVar1) {
      return local_4c;
    }
    usleep(10000);
    if (!bVar10) {
      return -0x80000000;
    }
  } while( true );
}

Assistant:

static int32_t pool_sync2(ProcPool *pool) {
    bool any_valid = false;
    do {
        for (int32_t idx = 0; idx < MIN(pool->max_num_procs, PROC_POOL_SIZE);
             idx++) {
            Process *p = &pool->procs[idx];
            if (!p->valid) {
                continue;
            } else {
                any_valid = true;
            }

            if (pool->aborted) {
                assert(p->valid);

                // Kill it hard, we don't want CPTP to generate a suboptimal
                // solution in its JSON output
                kill(p->pid, SIGTERM);
            }

            int exit_status = 0;
            if (proc_terminated(p->pid, &exit_status)) {
                printf("Process %d %s [status=%d]: ", p->pid,
                       exit_status == 0 ? "exited correctly" : "failed",
                       exit_status);
                printf("(CMD");

                for (int32_t i = 0; i < PROC_MAX_ARGS - 1 && p->args[i] != NULL;
                     i++) {
                    printf(" %s", p->args[i]);
                }
                printf(")\n");
                if (pool->on_async_proc_exit) {
                    pool->on_async_proc_exit(p, exit_status, p->user_handle);
                }
                proc_destroy(p);
                return idx;
            }
        }
        usleep(PROC_POOL_UPDATE_PERIOD_MSEC * 1000);
    } while (any_valid);

    return INT32_MIN;
}